

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmBacktraceRange
GetPropertyBacktraces<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *content,vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *backtraces,
          unsigned_long contentEndPosition)

{
  const_iterator __first;
  iterator_type __last;
  difference_type __n;
  const_iterator end_00;
  cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
  cVar1;
  cmBacktraceRange cVar2;
  const_iterator end;
  __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_78;
  __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_70;
  const_iterator it;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_58;
  size_type local_48;
  const_reverse_iterator rbegin;
  const_iterator entryEnd;
  unsigned_long contentEndPosition_local;
  vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *backtraces_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  
  rbegin.current._M_current =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(content);
  local_58._8_8_ =
       __gnu_cxx::
       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::operator+(&rbegin.current,contentEndPosition);
  cmMakeReverseIterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::reverse_iterator(&local_60,
                     (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::rend((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&it);
  std::
  find<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__cxx11::string>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_58._M_allocated_capacity,&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
  local_48 = local_58._M_allocated_capacity;
  local_78._M_current =
       (cmListFileBacktrace *)
       std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::begin(backtraces);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(content);
  __last = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::base((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&local_48);
  __n = std::
        distance<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__first._M_current,
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__last._M_current);
  local_70 = __gnu_cxx::
             __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
             ::operator+(&local_78,__n);
  end_00 = std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::end(backtraces);
  cVar1 = cmMakeRange<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>
                    (local_70,(__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                               )end_00._M_current);
  cVar2.Begin._M_current = cVar1.Begin._M_current;
  cVar2.End._M_current = cVar1.End._M_current;
  return cVar2;
}

Assistant:

cmBacktraceRange GetPropertyBacktraces(T const& content,
                                    U const& backtraces,
                                    V contentEndPosition)
{
  std::vector<std::string>::const_iterator entryEnd =
      content.begin() + contentEndPosition;

  std::vector<std::string>::const_reverse_iterator rbegin =
      cmMakeReverseIterator(entryEnd);
  rbegin = std::find(rbegin, content.rend(), cmPropertySentinal);

  std::vector<cmListFileBacktrace>::const_iterator it =
      backtraces.begin() + std::distance(content.begin(), rbegin.base());

  std::vector<cmListFileBacktrace>::const_iterator end = backtraces.end();
  return cmMakeRange(it, end);
}